

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

void __thiscall
icu_63::CollationSettings::setReordering
          (CollationSettings *this,CollationData *data,int32_t *codes,int32_t codesLength,
          UErrorCode *errorCode)

{
  uint uVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  int32_t limit1;
  uint32_t pair;
  int32_t i;
  int32_t firstSplitByteRangeIndex;
  int32_t b;
  uint8_t table [256];
  uint32_t *local_70;
  uint32_t *ranges;
  int32_t rangesLength;
  undefined1 local_50 [8];
  UVector32 rangesList;
  UErrorCode *errorCode_local;
  int32_t codesLength_local;
  int32_t *codes_local;
  CollationData *data_local;
  CollationSettings *this_local;
  
  rangesList.elements = errorCode;
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    if ((codesLength == 0) || ((codesLength == 1 && (*codes == 0x67)))) {
      resetReordering(this);
    }
    else {
      UVector32::UVector32((UVector32 *)local_50,rangesList.elements);
      CollationData::makeReorderRanges
                (data,codes,codesLength,(UVector32 *)local_50,rangesList.elements);
      UVar2 = ::U_FAILURE(*rangesList.elements);
      if (UVar2 == '\0') {
        iVar3 = UVector32::size((UVector32 *)local_50);
        if (iVar3 == 0) {
          resetReordering(this);
        }
        else {
          local_70 = (uint32_t *)UVector32::getBuffer((UVector32 *)local_50);
          this->minHighNoReorder = local_70[iVar3 + -1] & 0xffff0000;
          i = 0;
          pair = 0xffffffff;
          for (limit1 = 0; limit1 < iVar3; limit1 = limit1 + 1) {
            uVar1 = local_70[limit1];
            uVar4 = uVar1 >> 0x18;
            for (; i < (int)uVar4; i = i + 1) {
              *(char *)((long)&firstSplitByteRangeIndex + (long)i) = (char)i + (char)uVar1;
            }
            if ((uVar1 & 0xff0000) != 0) {
              *(undefined1 *)((long)&firstSplitByteRangeIndex + (long)(int)uVar4) = 0;
              i = uVar4 + 1;
              if ((int)pair < 0) {
                pair = limit1;
              }
            }
          }
          for (; i < 0x100; i = i + 1) {
            *(char *)((long)&firstSplitByteRangeIndex + (long)i) = (char)i;
          }
          if ((int)pair < 0) {
            ranges._4_4_ = 0;
          }
          else {
            local_70 = local_70 + (int)pair;
            ranges._4_4_ = iVar3 - pair;
          }
          setReorderArrays(this,codes,codesLength,local_70,ranges._4_4_,
                           (uint8_t *)&firstSplitByteRangeIndex,rangesList.elements);
        }
      }
      UVector32::~UVector32((UVector32 *)local_50);
    }
  }
  return;
}

Assistant:

void
CollationSettings::setReordering(const CollationData &data,
                                 const int32_t *codes, int32_t codesLength,
                                 UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(codesLength == 0 || (codesLength == 1 && codes[0] == UCOL_REORDER_CODE_NONE)) {
        resetReordering();
        return;
    }
    UVector32 rangesList(errorCode);
    data.makeReorderRanges(codes, codesLength, rangesList, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    int32_t rangesLength = rangesList.size();
    if(rangesLength == 0) {
        resetReordering();
        return;
    }
    const uint32_t *ranges = reinterpret_cast<uint32_t *>(rangesList.getBuffer());
    // ranges[] contains at least two (limit, offset) pairs.
    // The first offset must be 0. The last offset must not be 0.
    // Separators (at the low end) and trailing weights (at the high end)
    // are never reordered.
    U_ASSERT(rangesLength >= 2);
    U_ASSERT((ranges[0] & 0xffff) == 0 && (ranges[rangesLength - 1] & 0xffff) != 0);
    minHighNoReorder = ranges[rangesLength - 1] & 0xffff0000;

    // Write the lead byte permutation table.
    // Set a 0 for each lead byte that has a range boundary in the middle.
    uint8_t table[256];
    int32_t b = 0;
    int32_t firstSplitByteRangeIndex = -1;
    for(int32_t i = 0; i < rangesLength; ++i) {
        uint32_t pair = ranges[i];
        int32_t limit1 = (int32_t)(pair >> 24);
        while(b < limit1) {
            table[b] = (uint8_t)(b + pair);
            ++b;
        }
        // Check the second byte of the limit.
        if((pair & 0xff0000) != 0) {
            table[limit1] = 0;
            b = limit1 + 1;
            if(firstSplitByteRangeIndex < 0) {
                firstSplitByteRangeIndex = i;
            }
        }
    }
    while(b <= 0xff) {
        table[b] = (uint8_t)b;
        ++b;
    }
    if(firstSplitByteRangeIndex < 0) {
        // The lead byte permutation table alone suffices for reordering.
        rangesLength = 0;
    } else {
        // Remove the ranges below the first split byte.
        ranges += firstSplitByteRangeIndex;
        rangesLength -= firstSplitByteRangeIndex;
    }
    setReorderArrays(codes, codesLength, ranges, rangesLength, table, errorCode);
}